

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O2

int cr_realloc(CharRange *cr,int size)

{
  int iVar1;
  uint32_t *puVar2;
  int iVar3;
  
  iVar3 = 0;
  if (cr->size < size) {
    iVar1 = (cr->size * 3) / 2;
    if (iVar1 < size) {
      iVar1 = size;
    }
    puVar2 = (uint32_t *)(*cr->realloc_func)(cr->mem_opaque,cr->points,(long)iVar1 << 2);
    if (puVar2 == (uint32_t *)0x0) {
      iVar3 = -1;
    }
    else {
      cr->points = puVar2;
      cr->size = iVar1;
    }
  }
  return iVar3;
}

Assistant:

int cr_realloc(CharRange *cr, int size)
{
    int new_size;
    uint32_t *new_buf;
    
    if (size > cr->size) {
        new_size = max_int(size, cr->size * 3 / 2);
        new_buf = cr->realloc_func(cr->mem_opaque, cr->points,
                                   new_size * sizeof(cr->points[0]));
        if (!new_buf)
            return -1;
        cr->points = new_buf;
        cr->size = new_size;
    }
    return 0;
}